

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Worker *worker)

{
  ostream *poVar1;
  Worker *worker_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,(string *)worker);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,worker->Age);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,worker->Salary);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const Worker& worker)
    {
        return os << worker.Name << " " << worker.Age << " " << worker.Salary;
    }